

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response.c
# Opt level: O2

void response_data_free(CManager cm,void *resp_void)

{
  void *__ptr;
  undefined8 *puVar1;
  int i;
  long lVar2;
  long lStack_30;
  
  switch(*resp_void) {
  case 0:
  case 2:
    free_struct_list(*(FMStructDescList *)((long)resp_void + 8));
    break;
  case 1:
    free_struct_list(*(FMStructDescList *)((long)resp_void + 8));
    free_struct_list(*(FMStructDescList *)((long)resp_void + 0x10));
    lStack_30 = 0x18;
    goto LAB_0013671a;
  case 3:
    lVar2 = 0;
    while( true ) {
      __ptr = *(void **)((long)*(void **)((long)resp_void + 8) + lVar2 * 8);
      if (__ptr == (void *)0x0) break;
      for (puVar1 = (undefined8 *)((long)__ptr + 8); (void *)puVar1[-1] != (void *)0x0;
          puVar1 = puVar1 + 4) {
        free((void *)puVar1[-1]);
        free_FMfield_list(*puVar1);
      }
      free(__ptr);
      lVar2 = lVar2 + 1;
    }
    free(*(void **)((long)resp_void + 8));
    free(*(void **)((long)resp_void + 0x28));
    break;
  default:
    goto switchD_001366a8_default;
  }
  lStack_30 = 0x10;
LAB_0013671a:
  free(*(void **)((long)resp_void + lStack_30));
switchD_001366a8_default:
  free(resp_void);
  return;
}

Assistant:

void
response_data_free(CManager cm, void *resp_void)
{
    struct response_spec *resp = (struct response_spec*)resp_void;
    switch(resp->response_type) {
    case Response_Filter:
    case Response_Router:
	free_struct_list(resp->u.filter.format_list);
        free(resp->u.filter.function);
	break;
    case Response_Transform:
	free_struct_list(resp->u.transform.in_format_list);
	free_struct_list(resp->u.transform.out_format_list);
        free(resp->u.transform.function);
	break;
    case Response_Multityped:
      {
	  int i = 0;
	  while(resp->u.multityped.struct_list[i] != NULL) {
	      FMStructDescList list = resp->u.multityped.struct_list[i];
	      int j = 0;
	      while (list[j].format_name != NULL) {
		  free((void*)list[j].format_name);
		  free_FMfield_list(list[j].field_list);
		  j++;
	      }
	      free(list);
	      i++;
	  }
      }
      free(resp->u.multityped.struct_list);
      free(resp->u.multityped.reference_input_format_list);
      free(resp->u.multityped.function);
      break;
    default:
	break;
    }
    free(resp);
}